

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGame.cpp
# Opt level: O2

void __thiscall
BayesianGame::BayesianGame
          (BayesianGame *this,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes)

{
  size_t nrS;
  size_t nrJA;
  Index i;
  ulong uVar1;
  RewardModelMapping r;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  RewardModelMapping local_a8;
  
  BayesianGameBase::BayesianGameBase(&this->super_BayesianGameBase,nrAgents,nrActions,nrTypes,0);
  (this->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGame_005d8050;
  (this->_m_utilFuncs).super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_utilFuncs).super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_utilFuncs).super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrS = (this->super_BayesianGameBase)._m_nrJTypes;
  nrJA = (this->super_BayesianGameBase)._m_nrJA;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"type",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"ja",&local_ea);
  RewardModelMapping::RewardModelMapping(&local_a8,nrS,nrJA,&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  for (uVar1 = 0; uVar1 < (this->super_BayesianGameBase)._m_nrAgents;
      uVar1 = (ulong)((int)uVar1 + 1)) {
    std::vector<RewardModelMapping,_std::allocator<RewardModelMapping>_>::push_back
              (&this->_m_utilFuncs,&local_a8);
  }
  RewardModelMapping::~RewardModelMapping(&local_a8);
  return;
}

Assistant:

BayesianGame::BayesianGame(size_t nrAgents, const vector<size_t> &nrActions,  
                           const vector<size_t> &nrTypes) :
    BayesianGameBase(nrAgents, nrActions, nrTypes)
{
    //initialize the utility functions
    RewardModelMapping r(_m_nrJTypes, _m_nrJA, "type", "ja");
    for(Index i = 0; i < _m_nrAgents; i++)
        _m_utilFuncs.push_back(r); //r is copied by value so we get independent
        //copies in _m_utilFuncs.

}